

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlOutputBufferWriteEscape
              (xmlOutputBufferPtr out,xmlChar *str,xmlCharEncodingOutputFunc escaping)

{
  xmlOutputWriteCallback p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  xmlBufPtr pxVar7;
  xmlChar *pxVar8;
  xmlBufPtr *ppxVar9;
  xmlBufPtr *ppxVar10;
  int iVar11;
  int cons;
  int chunk;
  int local_58;
  int local_54;
  xmlBufPtr *local_50;
  xmlBufPtr *local_48;
  void *local_40;
  xmlCharEncodingOutputFunc local_38;
  
  if ((((out != (xmlOutputBufferPtr)0x0) && (str != (xmlChar *)0x0)) && (out->error == 0)) &&
     ((out->buffer != (xmlBufPtr)0x0 && (iVar2 = xmlBufGetAllocationScheme(out->buffer), iVar2 != 2)
      ))) {
    sVar5 = strlen((char *)str);
    if ((int)sVar5 < 0) {
      return 0;
    }
    if (out->error == 0) {
      local_48 = &out->buffer;
      local_38 = xmlEscapeContent;
      if (escaping != (xmlCharEncodingOutputFunc)0x0) {
        local_38 = escaping;
      }
      local_50 = &out->conv;
      iVar2 = 0;
      do {
        ppxVar10 = local_48;
        iVar11 = (int)sVar5;
        local_58 = iVar11;
        sVar6 = xmlBufAvail(*local_48);
        local_54 = (int)sVar6;
        if (local_54 < 0x28) {
          iVar3 = xmlBufGrow(*ppxVar10,100);
          iVar11 = -1;
          if (iVar3 < 0) {
            return -1;
          }
        }
        else {
          if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
            pxVar8 = xmlBufEnd(*ppxVar10);
            iVar3 = (*local_38)(pxVar8,&local_54,str,&local_58);
            if (iVar3 < 0) {
              return -1;
            }
            if (local_54 == 0) {
              return -1;
            }
            xmlBufAddLen(out->buffer,(long)local_54);
            ppxVar9 = ppxVar10;
            iVar3 = local_54;
            if (out->writecallback == (xmlOutputWriteCallback)0x0) goto LAB_00198c11;
LAB_00198ba4:
            sVar6 = xmlBufUse(*ppxVar9);
            iVar3 = (int)sVar6;
            p_Var1 = out->writecallback;
            str = str + local_58;
            sVar5 = (size_t)(uint)(iVar11 - local_58);
            ppxVar10 = local_48;
            if (p_Var1 == (xmlOutputWriteCallback)0x0) goto LAB_00198c1b;
            if ((iVar3 < 4000) && (iVar11 - local_58 < 1)) {
              return iVar2;
            }
            local_40 = out->context;
            if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
              pxVar8 = xmlBufContent(*local_48);
              uVar4 = (*p_Var1)(local_40,(char *)pxVar8,iVar3);
              ppxVar10 = local_48;
            }
            else {
              pxVar8 = xmlBufContent(*local_50);
              uVar4 = (*p_Var1)(local_40,(char *)pxVar8,iVar3);
              ppxVar10 = local_50;
            }
            if ((int)uVar4 < 0) {
              iVar2 = 0x60a;
              __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)0x0);
LAB_00198d01:
              out->error = iVar2;
              return uVar4;
            }
            xmlBufShrink(*ppxVar10,(ulong)uVar4);
            if ((int)(uVar4 ^ 0x7fffffff) < out->written) {
              out->written = 0x7fffffff;
            }
            else {
              out->written = out->written + uVar4;
            }
          }
          else {
            if (*local_50 == (xmlBufPtr)0x0) {
              pxVar7 = xmlBufCreate();
              *local_50 = pxVar7;
            }
            pxVar8 = xmlBufEnd(*ppxVar10);
            iVar3 = (*local_38)(pxVar8,&local_54,str,&local_58);
            if (iVar3 < 0) {
              return -1;
            }
            if (local_54 == 0) {
              return -1;
            }
            xmlBufAddLen(*ppxVar10,(long)local_54);
            sVar6 = xmlBufUse(*ppxVar10);
            if ((sVar6 < 4000) && (local_58 == iVar11)) {
              return iVar2;
            }
            iVar3 = xmlCharEncOutput(out,0);
            if (iVar3 != -3 && iVar3 < 0) {
              iVar2 = 0x608;
              __xmlSimpleError(8,0x608,(xmlNodePtr)0x0,"encoder error",(char *)0x0);
              uVar4 = 0xffffffff;
              goto LAB_00198d01;
            }
            ppxVar9 = local_50;
            if (out->writecallback != (xmlOutputWriteCallback)0x0) goto LAB_00198ba4;
            if (iVar3 < 1) {
              iVar3 = 0;
            }
LAB_00198c11:
            str = str + local_58;
            sVar5 = (size_t)(uint)(iVar11 - local_58);
LAB_00198c1b:
            sVar6 = xmlBufAvail(*ppxVar10);
            if (sVar6 < 4000) {
              xmlBufGrow(*ppxVar10,4000);
            }
          }
          iVar11 = iVar2;
          iVar2 = iVar3 + iVar2;
        }
        if ((int)sVar5 < 1) {
          return iVar2;
        }
        if (iVar11 == iVar2) {
          return iVar2;
        }
      } while( true );
    }
  }
  return -1;
}

Assistant:

int
xmlOutputBufferWriteEscape(xmlOutputBufferPtr out, const xmlChar *str,
                           xmlCharEncodingOutputFunc escaping) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int oldwritten=0;/* loop guard */
    int chunk;       /* number of byte currently processed from str */
    int len;         /* number of bytes in str */
    int cons;        /* byte from str consumed */

    if ((out == NULL) || (out->error) || (str == NULL) ||
        (out->buffer == NULL) ||
	(xmlBufGetAllocationScheme(out->buffer) == XML_BUFFER_ALLOC_IMMUTABLE))
        return(-1);
    len = strlen((const char *)str);
    if (len < 0) return(0);
    if (out->error) return(-1);
    if (escaping == NULL) escaping = xmlEscapeContent;

    do {
        oldwritten = written;

        /*
	 * how many bytes to consume and how many bytes to store.
	 */
	cons = len;
	chunk = xmlBufAvail(out->buffer);

        /*
	 * make sure we have enough room to save first, if this is
	 * not the case force a flush, but make sure we stay in the loop
	 */
	if (chunk < 40) {
	    if (xmlBufGrow(out->buffer, 100) < 0)
	        return(-1);
            oldwritten = -1;
	    continue;
	}

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = escaping(xmlBufEnd(out->buffer) ,
	                   &chunk, str, &cons);
	    if ((ret < 0) || (chunk == 0)) /* chunk==0 => nothing done */
	        return(-1);
            xmlBufAddLen(out->buffer, chunk);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (cons == len))
		goto done;

	    /*
	     * convert as much as possible to the output buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            if (out->writecallback)
	        nbchars = xmlBufUse(out->conv);
            else
                nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = escaping(xmlBufEnd(out->buffer), &chunk, str, &cons);
	    if ((ret < 0) || (chunk == 0)) /* chunk==0 => nothing done */
	        return(-1);
            xmlBufAddLen(out->buffer, chunk);
            if (out->writecallback)
	        nbchars = xmlBufUse(out->buffer);
            else
                nbchars = chunk;
	}
	str += cons;
	len -= cons;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	} else if (xmlBufAvail(out->buffer) < MINLEN) {
	    xmlBufGrow(out->buffer, MINLEN);
	}
	written += nbchars;
    } while ((len > 0) && (oldwritten != written));

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}